

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanocat.c
# Opt level: O0

void nn_send_loop(nn_options_t *options,int sock)

{
  int iVar1;
  long lVar2;
  uint64_t uVar3;
  int *piVar4;
  uint64_t uVar5;
  long lVar6;
  int64_t interval;
  int64_t time_to_sleep;
  uint64_t start_time;
  int rc;
  int sock_local;
  nn_options_t *options_local;
  
  lVar2 = (long)(int)(options->send_interval * 1000.0);
  while( true ) {
    uVar3 = nn_clock_ms();
    iVar1 = nn_send(sock,(options->data_to_send).data,(long)(options->data_to_send).length,0);
    if ((iVar1 < 0) && (piVar4 = __errno_location(), *piVar4 == 0xb)) {
      fprintf(_stderr,"Message not sent (EAGAIN)\n");
    }
    else {
      nn_assert_errno((uint)(-1 < iVar1),"Can\'t send");
    }
    if (lVar2 < 0) break;
    uVar5 = nn_clock_ms();
    lVar6 = (uVar3 + lVar2) - uVar5;
    if (0 < lVar6) {
      nn_sleep((int)lVar6);
    }
  }
  return;
}

Assistant:

void nn_send_loop (nn_options_t *options, int sock)
{
    int rc;
    uint64_t start_time;
    int64_t time_to_sleep, interval;

    interval = (int)(options->send_interval*1000);

    for (;;) {
        start_time = nn_clock_ms();
        rc = nn_send (sock,
            options->data_to_send.data, options->data_to_send.length,
            0);
        if (rc < 0 && errno == EAGAIN) {
            fprintf (stderr, "Message not sent (EAGAIN)\n");
        } else {
            nn_assert_errno (rc >= 0, "Can't send");
        }
        if (interval >= 0) {
            time_to_sleep = (start_time + interval) - nn_clock_ms();
            if (time_to_sleep > 0) {
                nn_sleep ((int) time_to_sleep);
            }
        } else {
            break;
        }
    }
}